

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_relation.cpp
# Opt level: O1

void __thiscall
duckdb::AggregateRelation::AggregateRelation
          (AggregateRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *parsed_expressions)

{
  pointer puVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Relation *pRVar4;
  string local_48;
  
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(child_p);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_4f001a4 + 9);
  Relation::Relation(&this->super_Relation,&pRVar4->context,AGGREGATE_RELATION,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__AggregateRelation_024a4960;
  puVar1 = (parsed_expressions->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parsed_expressions->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parsed_expressions->
       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parsed_expressions->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (parsed_expressions->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parsed_expressions->
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groups).grouping_sets.
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groups).grouping_sets.
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->groups).group_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->groups).grouping_sets.
  super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  .
  super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groups).group_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groups).group_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  return;
}

Assistant:

AggregateRelation::AggregateRelation(shared_ptr<Relation> child_p,
                                     vector<unique_ptr<ParsedExpression>> parsed_expressions)
    : Relation(child_p->context, RelationType::AGGREGATE_RELATION), expressions(std::move(parsed_expressions)),
      child(std::move(child_p)) {
	// bind the expressions
	TryBindRelation(columns);
}